

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

size_t __thiscall clipp::parser::occurrences_of(parser *this,parameter *p)

{
  size_t sVar1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
  i;
  pointer local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
  local_20;
  __normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  local_18;
  
  if (p != (parameter *)0x0) {
    local_20.current._M_current =
         (__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
          )(this->args_).
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    local_28 = (this->args_).
               super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
    std::
    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_const*,std::vector<clipp::parser::arg_mapping,std::allocator<clipp::parser::arg_mapping>>>>,clipp::parser::occurrences_of(clipp::parameter_const*)const::_lambda(clipp::parser::arg_mapping_const&)_1_>
              ((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                *)&local_18,&local_20,(parameter *)&local_28);
    if (local_18._M_current ==
        (this->args_).
        super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      sVar1 = 0;
    }
    else {
      sVar1 = local_18._M_current[-1].repeat_ + 1;
    }
    return sVar1;
  }
  return 0;
}

Assistant:

std::size_t occurrences_of(const parameter* p) const
    {
        if(!p) return 0;

        auto i = std::find_if(args_.rbegin(), args_.rend(),
            [p](const arg_mapping& a){ return a.param() == p; });

        if(i != args_.rend()) return i->repeat() + 1;
        return 0;
    }